

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ModuleHeaderSyntax::setChild
          (ModuleHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  PortListSyntax *local_160;
  ParameterPortListSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ModuleHeaderSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->moduleKeyword).kind = (undefined2)local_28;
    (this->moduleKeyword).field_0x2 = local_28._2_1_;
    (this->moduleKeyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->moduleKeyword).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->moduleKeyword).info = local_20;
    break;
  case 1:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->lifetime).kind = (undefined2)local_38;
    (this->lifetime).field_0x2 = local_38._2_1_;
    (this->lifetime).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->lifetime).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->lifetime).info = local_30;
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->name).kind = (undefined2)local_48;
    (this->name).field_0x2 = local_48._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->name).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->name).info = local_40;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::
             as<slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>>(pSVar2);
    SyntaxList<slang::syntax::PackageImportDeclarationSyntax>::operator=(&this->imports,pSVar1);
    break;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_158 = (ParameterPortListSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::ParameterPortListSyntax>(pSVar2);
    }
    this->parameters = local_158;
    break;
  case 5:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_160 = (PortListSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_160 = SyntaxNode::as<slang::syntax::PortListSyntax>(pSVar2);
    }
    this->ports = local_160;
    break;
  case 6:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_58;
    (this->semi).field_0x2 = local_58._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->semi).rawLen = local_58._4_4_;
    local_50 = TVar3.info;
    (this->semi).info = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x213e);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ModuleHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: moduleKeyword = child.token(); return;
        case 1: lifetime = child.token(); return;
        case 2: name = child.token(); return;
        case 3: imports = child.node()->as<SyntaxList<PackageImportDeclarationSyntax>>(); return;
        case 4: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 5: ports = child.node() ? &child.node()->as<PortListSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}